

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O0

int bmp_read_info(gdIOCtx *infile,bmp_info_t *info)

{
  int iVar1;
  bmp_info_t *info_local;
  gdIOCtx *infile_local;
  
  iVar1 = gdGetIntLSB(&info->len,infile);
  if (iVar1 == 0) {
    return 1;
  }
  iVar1 = info->len;
  if (iVar1 == 0xc) {
    iVar1 = bmp_read_os2_v1_info(infile,info);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    if (iVar1 != 0x28) {
      if (iVar1 == 0x40) {
        iVar1 = bmp_read_os2_v2_info(infile,info);
        if (iVar1 == 0) {
          return 0;
        }
        return 1;
      }
      if ((iVar1 != 0x6c) && (iVar1 != 0x7c)) {
        return 1;
      }
    }
    iVar1 = bmp_read_windows_v3_info(infile,info);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int bmp_read_info(gdIOCtx *infile, bmp_info_t *info)
{
	/* read BMP length so we can work out the version */
	if (!gdGetIntLSB(&info->len, infile)) {
		return 1;
	}

	switch (info->len) {
		/* For now treat Windows v4 + v5 as v3 */
	case BMP_WINDOWS_V3:
	case BMP_WINDOWS_V4:
	case BMP_WINDOWS_V5:
		BMP_DEBUG(printf("Reading Windows Header\n"));
		if (bmp_read_windows_v3_info(infile, info)) {
			return 1;
		}
		break;
	case BMP_OS2_V1:
		if (bmp_read_os2_v1_info(infile, info)) {
			return 1;
		}
		break;
	case BMP_OS2_V2:
		if (bmp_read_os2_v2_info(infile, info)) {
			return 1;
		}
		break;
	default:
		BMP_DEBUG(printf("Unhandled bitmap\n"));
		return 1;
	}
	return 0;
}